

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * __thiscall
duckdb::DataTable::GetTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,DataTable *this)

{
  pointer pCVar1;
  LogicalType *__x;
  ColumnDefinition *it;
  pointer this_00;
  
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->column_definitions).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    __x = ColumnDefinition::Type(this_00);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> DataTable::GetTypes() {
	vector<LogicalType> types;
	for (auto &it : column_definitions) {
		types.push_back(it.Type());
	}
	return types;
}